

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void printUsage(string *exec)

{
  ostream *poVar1;
  string local_30 [8];
  string filename;
  string *exec_local;
  
  filename.field_2._8_8_ = exec;
  std::__cxx11::string::find_last_of((char *)exec,0x1480c8);
  std::__cxx11::string::substr((ulong)local_30,(ulong)exec);
  poVar1 = std::operator<<((ostream *)&std::cout,"Usage: ");
  poVar1 = std::operator<<(poVar1,local_30);
  poVar1 = std::operator<<(poVar1," input_file [options]");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,'\t');
  poVar1 = std::operator<<(poVar1,"-j, --json filepath");
  poVar1 = std::operator<<(poVar1,'\t');
  poVar1 = std::operator<<(poVar1,"output ast to json in filepath");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,'\t');
  poVar1 = std::operator<<(poVar1,"-d, --dot filepath");
  poVar1 = std::operator<<(poVar1,'\t');
  poVar1 = std::operator<<(poVar1,"output ast to dot in filepath");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void printUsage(std::string exec) {
	std::string filename = exec.substr(exec.find_last_of("/\\") + 1);
	std::cout <<   "Usage: " << filename << " input_file [options]" << std::endl;
	std::cout << '\t' << "-j, --json filepath" << '\t' << "output ast to json in filepath" << std::endl;
	std::cout << '\t' << "-d, --dot filepath" << '\t' << "output ast to dot in filepath" << std::endl;
}